

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

bool __thiscall capnp::_::ListReader::isCanonical(ListReader *this,word **readHead,WirePointer *ref)

{
  ElementSize EVar1;
  bool bVar2;
  word *pwVar3;
  word *pwVar4;
  uint uVar5;
  uint ec;
  ElementCount index;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint ec_1;
  byte bVar9;
  bool ptrTrunc;
  bool dataTrunc;
  Iterator __end3;
  word *pointerHead;
  word *local_78;
  word *listEnd;
  DebugComparison<const_capnp::word_*&,_const_capnp::word_*&> _kjCondition;
  
  EVar1 = this->elementSize;
  if (EVar1 == POINTER) {
    if ((word *)this->ptr == *readHead) {
      uVar7 = (ulong)this->elementCount;
      *readHead = *readHead + uVar7;
      if (uVar7 != 0) {
        lVar6 = 0;
        do {
          _kjCondition.op.content.ptr =
               (char *)(this->ptr +
                       ((ulong)this->step * lVar6 >> 3) + (ulong)(this->structDataSize >> 3));
          _kjCondition.left = (word **)this->segment;
          _kjCondition.right = (word **)this->capTable;
          _kjCondition.op.content.size_ =
               CONCAT44(_kjCondition.op.content.size_._4_4_,this->nestingLimit);
          bVar8 = PointerReader::isCanonical((PointerReader *)&_kjCondition,readHead);
          if (!(bool)bVar8) break;
          bVar2 = uVar7 - 1 != lVar6;
          lVar6 = lVar6 + 1;
        } while (bVar2);
        goto LAB_0035b732;
      }
LAB_0035b796:
      bVar8 = 1;
      goto LAB_0035b732;
    }
  }
  else if (EVar1 == INLINE_COMPOSITE) {
    pwVar3 = *readHead + 1;
    *readHead = pwVar3;
    if (((word *)this->ptr == pwVar3) && ((this->structDataSize & 0x3f) == 0)) {
      uVar5 = (this->structDataSize >> 6 & 0xffff) + (uint)this->structPointerCount;
      ___end3 = (ulong)this->elementCount;
      lVar6 = uVar5 * ___end3;
      if (lVar6 - (ulong)((ref->field_1).upper32Bits >> 3) == 0) {
        if (uVar5 != 0) {
          pointerHead = pwVar3 + lVar6;
          index = 0;
          pwVar4 = pointerHead;
          listEnd = pointerHead;
          if (this->elementCount != 0) {
            bVar8 = 0;
            bVar9 = 0;
            local_78 = pointerHead;
            do {
              getStructElement((StructReader *)&_kjCondition,this,index);
              bVar2 = StructReader::isCanonical
                                ((StructReader *)&_kjCondition,readHead,&pointerHead,&dataTrunc,
                                 &ptrTrunc);
              if (!bVar2) goto LAB_0035b730;
              bVar8 = bVar8 | dataTrunc;
              bVar9 = bVar9 | ptrTrunc;
              index = index + 1;
            } while (__end3.value != index);
            pwVar3 = *readHead;
            index = (ElementCount)(bVar8 & bVar9);
            pwVar4 = local_78;
          }
          bVar8 = (byte)index;
          _kjCondition.right = &listEnd;
          _kjCondition.op.content.ptr = " == ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = pwVar3 == pwVar4;
          if (!_kjCondition.result) {
            _kjCondition.left = readHead;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*&,capnp::word_const*&>&,capnp::word_const*&,capnp::word_const*&>
                      ((Fault *)&dataTrunc,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0xcd6,FAILED,"*readHead == listEnd","_kjCondition,*readHead, listEnd",
                       &_kjCondition,readHead,_kjCondition.right);
            kj::_::Debug::Fault::fatal((Fault *)&dataTrunc);
          }
          *readHead = pointerHead;
          goto LAB_0035b732;
        }
        goto LAB_0035b796;
      }
    }
  }
  else {
    pwVar3 = *readHead;
    if ((word *)this->ptr == pwVar3) {
      uVar7 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar1 * 4) *
              (ulong)this->elementCount;
      pwVar4 = (word *)((long)&pwVar3->content + (uVar7 >> 3));
      if ((uVar7 & 7) != 0) {
        if ((byte)((byte)pwVar4->content >> (sbyte)(uVar7 & 7)) != 0) goto LAB_0035b730;
        pwVar4 = (word *)((long)&pwVar4->content + 1);
      }
      for (; pwVar4 != pwVar3 + (uVar7 + 0x3f >> 6); pwVar4 = (word *)((long)&pwVar4->content + 1))
      {
        if ((char)pwVar4->content != '\0') goto LAB_0035b730;
      }
      *readHead = pwVar3 + (uVar7 + 0x3f >> 6);
      goto LAB_0035b796;
    }
  }
LAB_0035b730:
  bVar8 = 0;
LAB_0035b732:
  return (bool)(bVar8 & 1);
}

Assistant:

bool ListReader::isCanonical(const word **readHead, const WirePointer *ref) {
  switch (this->getElementSize()) {
    case ElementSize::INLINE_COMPOSITE: {
      *readHead += 1;
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        // The next word to read is the tag word, but the pointer is in
        // front of it, so our check is slightly different
        return false;
      }
      if (this->structDataSize % BITS_PER_WORD != ZERO * BITS) {
        return false;
      }
      auto elementSize = StructSize(this->structDataSize / BITS_PER_WORD,
                                    this->structPointerCount).total() / ELEMENTS;
      auto totalSize = upgradeBound<uint64_t>(this->elementCount) * elementSize;
      if (totalSize != ref->listRef.inlineCompositeWordCount()) {
        return false;
      }
      if (elementSize == ZERO * WORDS / ELEMENTS) {
        return true;
      }
      auto listEnd = *readHead + totalSize;
      auto pointerHead = listEnd;
      bool listDataTrunc = false;
      bool listPtrTrunc = false;
      for (auto ec: kj::zeroTo(this->elementCount)) {
        bool dataTrunc, ptrTrunc;
        if (!this->getStructElement(ec).isCanonical(readHead,
                                                    &pointerHead,
                                                    &dataTrunc,
                                                    &ptrTrunc)) {
          return false;
        }
        listDataTrunc |= dataTrunc;
        listPtrTrunc  |= ptrTrunc;
      }
      KJ_REQUIRE(*readHead == listEnd, *readHead, listEnd);
      *readHead = pointerHead;
      return listDataTrunc && listPtrTrunc;
    }
    case ElementSize::POINTER: {
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        return false;
      }
      *readHead += this->elementCount * (POINTERS / ELEMENTS) * WORDS_PER_POINTER;
      for (auto ec: kj::zeroTo(this->elementCount)) {
        if (!this->getPointerElement(ec).isCanonical(readHead)) {
          return false;
        }
      }
      return true;
    }
    default: {
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        return false;
      }

      auto bitSize = upgradeBound<uint64_t>(this->elementCount) *
                     dataBitsPerElement(this->elementSize);
      auto truncatedByteSize = bitSize / BITS_PER_BYTE;
      auto byteReadHead = reinterpret_cast<const uint8_t*>(*readHead) + truncatedByteSize;
      auto readHeadEnd = *readHead + WireHelpers::roundBitsUpToWords(bitSize);

      auto leftoverBits = bitSize % BITS_PER_BYTE;
      if (leftoverBits > ZERO * BITS) {
        auto mask = ~((1 << unbound(leftoverBits / BITS)) - 1);

        if (mask & *byteReadHead) {
          return false;
        }
        byteReadHead += 1;
      }

      while (byteReadHead != reinterpret_cast<const uint8_t*>(readHeadEnd)) {
        if (*byteReadHead != 0) {
          return false;
        }
        byteReadHead += 1;
      }

      *readHead = readHeadEnd;
      return true;
    }
  }
  KJ_UNREACHABLE;
}